

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatHeap.h
# Opt level: O3

void xSAT_HeapPercolateDown(xSAT_Heap_t *h,int i)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  
  if (i < 0) {
LAB_00906fca:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pVVar5 = h->vHeap;
  uVar8 = pVVar5->nSize;
  if ((int)uVar8 <= i) goto LAB_00906fca;
  piVar6 = pVVar5->pArray;
  uVar1 = piVar6[(uint)i];
  uVar9 = i * 2 + 1;
  if ((int)uVar9 < (int)uVar8) {
    iVar12 = i * 2;
    do {
      uVar11 = iVar12 + 2;
      if ((int)uVar11 < (int)uVar8) {
        if (((int)uVar11 < 0) || (i < 0)) goto LAB_00906fca;
        uVar2 = piVar6[uVar11];
        if ((int)uVar2 < 0) goto LAB_00906fca;
        uVar3 = h->vActivity->nSize;
        if ((int)uVar3 <= (int)uVar2) goto LAB_00906fca;
        uVar4 = piVar6[uVar9];
        if (((int)uVar4 < 0) || (uVar3 <= uVar4)) goto LAB_00906fca;
        piVar7 = h->vActivity->pArray;
        if ((uint)piVar7[uVar2] <= (uint)piVar7[uVar4]) {
          uVar11 = uVar9;
        }
      }
      else {
        uVar11 = uVar9;
        if (i < 0) goto LAB_00906fca;
      }
      if ((int)uVar8 <= (int)uVar11) goto LAB_00906fca;
      iVar12 = piVar6[uVar11];
      lVar10 = (long)iVar12;
      if (lVar10 < 0) goto LAB_00906fca;
      uVar9 = h->vActivity->nSize;
      if ((((int)uVar9 <= iVar12) || ((int)uVar1 < 0)) || (uVar9 <= uVar1)) goto LAB_00906fca;
      piVar7 = h->vActivity->pArray;
      if ((uint)piVar7[lVar10] <= (uint)piVar7[uVar1]) goto LAB_00906fa5;
      if (uVar8 <= (uint)i) goto LAB_00906fe9;
      piVar6[(uint)i] = iVar12;
      if (pVVar5->nSize <= i) goto LAB_00906fca;
      if (h->vIndices->nSize <= iVar12) goto LAB_00906fe9;
      h->vIndices->pArray[lVar10] = i;
      iVar12 = uVar11 * 2;
      uVar9 = uVar11 * 2 + 1;
      uVar8 = pVVar5->nSize;
      i = uVar11;
    } while ((int)uVar9 < (int)uVar8);
    if ((int)uVar11 < 0) goto LAB_00906fe9;
  }
LAB_00906fa5:
  if (((i < (int)uVar8) && (piVar6[(uint)i] = uVar1, -1 < (int)uVar1)) &&
     ((int)uVar1 < h->vIndices->nSize)) {
    h->vIndices->pArray[uVar1] = i;
    return;
  }
LAB_00906fe9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void xSAT_HeapPercolateDown( xSAT_Heap_t * h, int i )
{
    int x = Vec_IntEntry( h->vHeap, i );

    while ( Left( i ) < Vec_IntSize( h->vHeap ) )
    {
        int child = Right( i ) < Vec_IntSize( h->vHeap ) &&
                    Compare( h, Vec_IntEntry( h->vHeap, Right( i ) ), Vec_IntEntry( h->vHeap, Left( i ) ) ) ?
                    Right( i ) : Left( i );

        if ( !Compare( h, Vec_IntEntry( h->vHeap, child ), x ) )
            break;

        Vec_IntWriteEntry( h->vHeap, i, Vec_IntEntry( h->vHeap, child ) );
        Vec_IntWriteEntry( h->vIndices, Vec_IntEntry( h->vHeap, i ), i );
        i = child;
    }
    Vec_IntWriteEntry( h->vHeap, i, x );
    Vec_IntWriteEntry( h->vIndices, x, i );
}